

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

vector<picnic_params_t,_std::allocator<picnic_params_t>_> * all_supported_parameters(void)

{
  long lVar1;
  vector<picnic_params_t,_std::allocator<picnic_params_t>_> *in_RDI;
  picnic_params_t param;
  picnic_params_t *__end1;
  picnic_params_t *__begin1;
  picnic_params_t (*__range1) [12];
  vector<picnic_params_t,_std::allocator<picnic_params_t>_> *res;
  vector<picnic_params_t,_std::allocator<picnic_params_t>_> *in_stack_ffffffffffffffc0;
  eh_frame_hdr *local_20;
  
  std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>::vector
            ((vector<picnic_params_t,_std::allocator<picnic_params_t>_> *)0x1d2ca0);
  for (local_20 = (eh_frame_hdr *)&(anonymous_namespace)::all_parameters;
      local_20 != &__GNU_EH_FRAME_HDR; local_20 = local_20 + 1) {
    lVar1 = picnic_signature_size(*local_20);
    if (lVar1 != 0) {
      std::vector<picnic_params_t,_std::allocator<picnic_params_t>_>::push_back
                (in_stack_ffffffffffffffc0,(value_type *)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<picnic_params_t> all_supported_parameters() {
  std::vector<picnic_params_t> res;
  for (const auto param : all_parameters) {
    if (picnic_signature_size(param)) {
      res.push_back(param);
    }
  }
  return res;
}